

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

string * __thiscall
flatbuffers::GetAnyValueS_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,BaseType type,uint8_t *data,
          Schema *schema,int type_index)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  BaseType type_00;
  ushort uVar4;
  int64_t t;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  undefined4 in_register_00000014;
  uint *data_00;
  char *pcVar10;
  uint *puVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  int *piVar15;
  flatbuffers *this_00;
  double t_00;
  string esc;
  string val;
  string local_90;
  ulong local_70;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  ulong local_40;
  int *local_38;
  
  data_00 = (uint *)CONCAT44(in_register_00000014,type);
  type_00 = (BaseType)this;
  switch(type_00) {
  case Float:
  case Double:
    t_00 = GetAnyValueF(type_00,(uint8_t *)data_00);
    FloatToString<double>(__return_storage_ptr__,t_00,0xc);
    return __return_storage_ptr__;
  case String:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)((long)data_00 + (ulong)*data_00 + 4),
               (allocator<char> *)&local_68);
    return __return_storage_ptr__;
  case Vector:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "[(elements)]";
    pcVar10 = "";
    break;
  case Obj:
    if (data != (uint8_t *)0x0) {
      if (*(ushort *)(data + -(long)*(int *)data) < 5) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ushort *)(data + (4 - (long)*(int *)data));
      }
      if (uVar4 == 0) {
        puVar11 = (uint *)0x0;
      }
      else {
        puVar11 = (uint *)(data + (ulong)*(uint *)(data + uVar4) + (ulong)uVar4);
      }
      if ((uint)schema < *puVar11) {
        uVar14 = (ulong)((uint)schema << 2);
        local_40 = (ulong)*(uint *)((long)puVar11 + uVar14 + 4);
        lVar12 = local_40 + uVar14;
        piVar15 = (int *)((long)puVar11 + lVar12 + 4);
        if (*(ushort *)((long)piVar15 - (long)*piVar15) < 5) {
          uVar4 = 0;
        }
        else {
          uVar4 = *(ushort *)((long)puVar11 + ((lVar12 + 8) - (long)*piVar15));
        }
        uVar5 = (ulong)uVar4;
        uVar2 = *(uint *)((long)piVar15 + uVar5);
        puVar1 = (uint *)((long)piVar15 + uVar2 + uVar5);
        uVar3 = *puVar1;
        local_48 = &__return_storage_ptr__->field_2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,puVar1 + 1,
                   (long)piVar15 + (ulong)uVar3 + uVar2 + uVar5 + 4);
        if (*(ushort *)((long)piVar15 - (long)*piVar15) < 9) {
          uVar4 = 0;
        }
        else {
          uVar4 = *(ushort *)((long)puVar11 + ((lVar12 + 0xc) - (long)*piVar15));
        }
        if ((uVar4 != 0) && (*(char *)((long)piVar15 + (ulong)uVar4) != '\0')) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        local_70 = (ulong)*data_00;
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        if (*(ushort *)((long)piVar15 - (long)*piVar15) < 7) {
          uVar4 = 0;
        }
        else {
          uVar4 = *(ushort *)((long)puVar11 + ((lVar12 + 10) - (long)*piVar15));
        }
        uVar5 = (ulong)uVar4;
        uVar8 = (ulong)*(uint *)((long)piVar15 + uVar5);
        if ((*(uint *)((long)piVar15 + uVar8 + uVar5) & 0x3fffffff) != 0) {
          this_00 = (flatbuffers *)((long)data_00 + local_70);
          local_70 = (long)piVar15 + uVar8 + uVar5 + 4;
          piVar15 = (int *)((long)piVar15 + uVar8 + uVar5);
          lVar12 = (long)puVar11 + uVar5 + uVar8 + local_40 + uVar14;
          local_38 = piVar15;
          do {
            uVar14 = (ulong)*(uint *)(lVar12 + 8);
            lVar6 = uVar14 - (long)*(int *)(lVar12 + 8 + uVar14);
            if (*(ushort *)(lVar12 + 8 + lVar6) < 0xb) {
              uVar4 = 0;
            }
            else {
              uVar4 = *(ushort *)(lVar12 + 0x12 + lVar6);
            }
            if (uVar4 == 0) {
              uVar4 = 0;
            }
            else {
              uVar4 = *(ushort *)(lVar12 + 8 + uVar4 + uVar14);
            }
            if ((uVar4 < *(ushort *)(this_00 + -(long)*(int *)this_00)) &&
               (*(short *)(this_00 + ((ulong)uVar4 - (long)*(int *)this_00)) != 0)) {
              GetAnyFieldS_abi_cxx11_
                        (&local_68,this_00,(Table *)(uVar14 + lVar12 + 8),(Field *)data,schema);
              lVar6 = uVar14 - (long)*(int *)(lVar12 + 8 + uVar14);
              if (*(ushort *)(lVar12 + 8 + lVar6) < 7) {
                uVar4 = 0;
              }
              else {
                uVar4 = *(ushort *)(lVar12 + 0xe + lVar6);
              }
              if (uVar4 == 0) {
                piVar7 = (int *)0x0;
              }
              else {
                piVar7 = (int *)((ulong)*(uint *)(lVar12 + 8 + uVar4 + uVar14) + uVar4 + uVar14 +
                                 lVar12 + 8);
              }
              if (*(ushort *)((long)piVar7 - (long)*piVar7) < 5) {
                uVar4 = 0;
              }
              else {
                uVar4 = *(ushort *)((long)piVar7 + (4 - (long)*piVar7));
              }
              if ((uVar4 != 0) && (*(char *)((long)piVar7 + (ulong)uVar4) == '\r')) {
                local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
                local_90._M_string_length = 0;
                local_90.field_2._M_local_buf[0] = '\0';
                schema = (Schema *)0x0;
                EscapeString(local_68._M_dataplus._M_p,local_68._M_string_length,&local_90,true,
                             false);
                std::__cxx11::string::_M_assign((string *)&local_68);
                piVar15 = local_38;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                           local_90.field_2._M_local_buf[0]) + 1);
                  piVar15 = local_38;
                }
              }
              lVar6 = uVar14 - (long)*(int *)(lVar12 + 8 + uVar14);
              if (*(ushort *)(lVar12 + 8 + lVar6) < 5) {
                uVar4 = 0;
              }
              else {
                uVar4 = *(ushort *)(lVar12 + 0xc + lVar6);
              }
              lVar9 = (ulong)*(uint *)(lVar12 + 8 + uVar4 + uVar14) + uVar4 + uVar14;
              lVar6 = lVar9 + lVar12;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,lVar6 + 0xc,
                         (ulong)*(uint *)(lVar6 + 8) + lVar9 + lVar12 + 0xc);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,
                                CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                         local_90.field_2._M_local_buf[0]) + 1);
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
            }
            lVar6 = lVar12 + 0xc;
            lVar12 = lVar12 + 4;
          } while (lVar6 != (uint)(*piVar15 << 2) + local_70);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      __assert_fail("i < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                    ,0xc1,
                    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                   );
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "(table)";
    pcVar10 = "";
    break;
  case Union:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar13 = "(union)";
    pcVar10 = "";
    break;
  default:
    t = GetAnyValueI(type_00,(uint8_t *)data_00);
    NumToString<long>(__return_storage_ptr__,t);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar13,pcVar10);
  return __return_storage_ptr__;
}

Assistant:

std::string GetAnyValueS(reflection::BaseType type, const uint8_t *data,
                         const reflection::Schema *schema, int type_index) {
  switch (type) {
    case reflection::Float:
    case reflection::Double: return NumToString(GetAnyValueF(type, data));
    case reflection::String: {
      auto s =
          reinterpret_cast<const String *>(ReadScalar<uoffset_t>(data) + data);
      return s ? s->c_str() : "";
    }
    case reflection::Obj:
      if (schema) {
        // Convert the table to a string. This is mostly for debugging purposes,
        // and does NOT promise to be JSON compliant.
        // Also prefixes the type.
        auto &objectdef = *schema->objects()->Get(type_index);
        auto s = objectdef.name()->str();
        if (objectdef.is_struct()) {
          s += "(struct)";  // TODO: implement this as well.
        } else {
          auto table_field = reinterpret_cast<const Table *>(
              ReadScalar<uoffset_t>(data) + data);
          s += " { ";
          auto fielddefs = objectdef.fields();
          for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
            auto &fielddef = **it;
            if (!table_field->CheckField(fielddef.offset())) continue;
            auto val = GetAnyFieldS(*table_field, fielddef, schema);
            if (fielddef.type()->base_type() == reflection::String) {
              std::string esc;
              flatbuffers::EscapeString(val.c_str(), val.length(), &esc, true,
                                        false);
              val = esc;
            }
            s += fielddef.name()->str();
            s += ": ";
            s += val;
            s += ", ";
          }
          s += "}";
        }
        return s;
      } else {
        return "(table)";
      }
    case reflection::Vector:
      return "[(elements)]";                   // TODO: implement this as well.
    case reflection::Union: return "(union)";  // TODO: implement this as well.
    default: return NumToString(GetAnyValueI(type, data));
  }
}